

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-util.cpp
# Opt level: O3

void grind_task(uint32_t nBits,CBlockHeader header,uint32_t offset,uint32_t step,atomic<bool> *found
               ,uint32_t *proposed_nonce)

{
  __int_type _Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  arith_uint256 target;
  bool local_9a;
  bool local_99;
  uint256 local_98;
  base_uint<256U> local_78;
  base_uint<256U> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.pn[4] = 0;
  local_58.pn[5] = 0;
  local_58.pn[6] = 0;
  local_58.pn[7] = 0;
  local_58.pn[0] = 0;
  local_58.pn[1] = 0;
  local_58.pn[2] = 0;
  local_58.pn[3] = 0;
  arith_uint256::SetCompact((arith_uint256 *)&local_58,nBits,&local_99,&local_9a);
  bVar2 = base_uint<256U>::EqualTo(&local_58,0);
  if (((!bVar2) && (local_99 == false)) && (local_9a == false)) {
    uVar4 = (~step - ~step % step) + offset;
    header.nNonce = offset;
    if (offset < uVar4 && ((found->_M_base)._M_i & 1U) == 0) {
      do {
        uVar5 = header.nNonce + step * 5000;
        if (uVar4 - header.nNonce < step * 5000) {
          uVar5 = uVar4;
        }
        do {
          CBlockHeader::GetHash(&local_98,&header);
          UintToArith256((arith_uint256 *)&local_78,&local_98);
          iVar3 = base_uint<256U>::CompareTo(&local_78,&local_58);
          if (iVar3 < 1) {
            LOCK();
            _Var1 = (found->_M_base)._M_i;
            (found->_M_base)._M_i = true;
            UNLOCK();
            if ((_Var1 & 1U) == 0) {
              *proposed_nonce = header.nNonce;
            }
            goto LAB_0010d44b;
          }
          header.nNonce = header.nNonce + step;
        } while (header.nNonce != uVar5);
      } while ((((found->_M_base)._M_i & 1U) == 0) && (header.nNonce < uVar4));
    }
  }
LAB_0010d44b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void grind_task(uint32_t nBits, CBlockHeader header, uint32_t offset, uint32_t step, std::atomic<bool>& found, uint32_t& proposed_nonce)
{
    arith_uint256 target;
    bool neg, over;
    target.SetCompact(nBits, &neg, &over);
    if (target == 0 || neg || over) return;
    header.nNonce = offset;

    uint32_t finish = std::numeric_limits<uint32_t>::max() - step;
    finish = finish - (finish % step) + offset;

    while (!found && header.nNonce < finish) {
        const uint32_t next = (finish - header.nNonce < 5000*step) ? finish : header.nNonce + 5000*step;
        do {
            if (UintToArith256(header.GetHash()) <= target) {
                if (!found.exchange(true)) {
                    proposed_nonce = header.nNonce;
                }
                return;
            }
            header.nNonce += step;
        } while(header.nNonce != next);
    }
}